

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::PrecisionFormatCase::test(PrecisionFormatCase *this)

{
  ostringstream *poVar1;
  int iVar2;
  undefined8 uVar3;
  int iVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  StateQueryMemoryWriteGuard<int> precision;
  StateQueryMemoryWriteGuard<int[2]> range;
  StateQueryMemoryWriteGuard<int> local_1d4;
  StateQueryMemoryWriteGuard<int[2]> local_1c8;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  lVar6 = (long)(int)(this->m_precisionType - 0x8df0);
  uVar3 = *(undefined8 *)(&DAT_01c19cc0 + lVar6 * 0xc);
  iVar2 = *(int *)(&DAT_01c19cc8 + lVar6 * 0xc);
  local_1c8.m_postguard[0] = -0x21212122;
  local_1c8.m_postguard[1] = -0x21212122;
  local_1c8.m_preguard[0] = -0x21212122;
  local_1c8.m_preguard[1] = -0x21212122;
  local_1c8.m_value[0] = -0x21212122;
  local_1c8.m_value[1] = -0x21212122;
  local_1d4.m_preguard = -0x21212122;
  local_1d4.m_value = -0x21212122;
  local_1d4.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetShaderPrecisionFormat
            (&(this->super_ApiCase).super_CallLogWrapper,this->m_shaderType,this->m_precisionType,
             local_1c8.m_value,&local_1d4.m_value);
  ApiCase::expectError(&this->super_ApiCase,0);
  bVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                    (&local_1c8,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (!bVar5) {
    return;
  }
  bVar5 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&local_1d4,
                     (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  if (!bVar5) {
    return;
  }
  local_1a8._0_8_ = (this->super_ApiCase).m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"range[0] = ",0xb);
  std::ostream::operator<<(poVar1,local_1c8.m_value[0]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"range[1] = ",0xb);
  std::ostream::operator<<(poVar1,local_1c8.m_value[1]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"precision = ",0xc);
  std::ostream::operator<<(poVar1,local_1d4.m_value);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_130);
  iVar4 = local_1c8.m_value[0];
  iVar7 = (int)uVar3;
  iVar8 = (int)((ulong)uVar3 >> 0x20);
  if (this->m_precisionType == 0x8df2) {
    if (((local_1c8.m_value[0] == iVar7) && (local_1c8.m_value[1] == iVar8)) &&
       (local_1d4.m_value == iVar2)) {
      return;
    }
    local_1a8._0_8_ = (this->super_ApiCase).m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Invalid precision format, expected:\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\trange[0] = ",0xc);
    std::ostream::operator<<(poVar1,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\trange[1] = ",0xc);
    std::ostream::operator<<(poVar1,iVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tprecision = ",0xd);
    std::ostream::operator<<(poVar1,iVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (local_1c8.m_value[0] < iVar7) {
      local_1a8._0_8_ = (this->super_ApiCase).m_log;
      poVar1 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"// ERROR: Invalid range[0], expected greater or equal to ",0x39)
      ;
      std::ostream::operator<<(poVar1,iVar7);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_130);
    }
    if (local_1c8.m_value[1] < iVar8) {
      local_1a8._0_8_ = (this->super_ApiCase).m_log;
      poVar1 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"// ERROR: Invalid range[1], expected greater or equal to ",0x39)
      ;
      std::ostream::operator<<(poVar1,iVar8);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_130);
      if (iVar2 <= local_1d4.m_value) goto LAB_0124522d;
    }
    else if (iVar2 <= local_1d4.m_value) {
      if (iVar7 <= iVar4) {
        return;
      }
      goto LAB_0124522d;
    }
    local_1a8._0_8_ = (this->super_ApiCase).m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// ERROR: Invalid precision, expected greater or equal to ",0x3a);
    std::ostream::operator<<(poVar1,iVar2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
  std::ios_base::~ios_base(local_130);
LAB_0124522d:
  tcu::TestContext::setTestResult
            ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_FAIL,"Got invalid precision/range");
  return;
}

Assistant:

void test (void)
	{
		const RequiredFormat											expected = getRequiredFormat();
		bool															error = false;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLboolean>	shaderCompiler;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint[2]>	range;
		gls::StateQueryUtil::StateQueryMemoryWriteGuard<glw::GLint>		precision;

		// query values
		glGetShaderPrecisionFormat(m_shaderType, m_precisionType, range, &precision);
		expectError(GL_NO_ERROR);

		if (!range.verifyValidity(m_testCtx))
			return;
		if (!precision.verifyValidity(m_testCtx))
			return;

		m_log
			<< tcu::TestLog::Message
			<< "range[0] = " << range[0] << "\n"
			<< "range[1] = " << range[1] << "\n"
			<< "precision = " << precision
			<< tcu::TestLog::EndMessage;

		// verify values

		if (m_precisionType == GL_HIGH_FLOAT)
		{
			// highp float must be IEEE 754 single

			if (range[0] != expected.negativeRange ||
				range[1] != expected.positiveRange ||
				precision != expected.precision)
			{
				m_log
					<< tcu::TestLog::Message
					<< "// ERROR: Invalid precision format, expected:\n"
					<< "\trange[0] = " << expected.negativeRange << "\n"
					<< "\trange[1] = " << expected.positiveRange << "\n"
					<< "\tprecision = " << expected.precision
					<< tcu::TestLog::EndMessage;
				error = true;
			}
		}
		else
		{
			if (range[0] < expected.negativeRange)
			{
				m_log << tcu::TestLog::Message << "// ERROR: Invalid range[0], expected greater or equal to " << expected.negativeRange << tcu::TestLog::EndMessage;
				error = true;
			}

			if (range[1] < expected.positiveRange)
			{
				m_log << tcu::TestLog::Message << "// ERROR: Invalid range[1], expected greater or equal to " << expected.positiveRange << tcu::TestLog::EndMessage;
				error = true;
			}

			if (precision < expected.precision)
			{
				m_log << tcu::TestLog::Message << "// ERROR: Invalid precision, expected greater or equal to " << expected.precision << tcu::TestLog::EndMessage;
				error = true;
			}
		}

		if (error)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid precision/range");
	}